

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall
glslang::HlslGrammar::acceptType(HlslGrammar *this,TType *type,TIntermNode **nodeList)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  EHlslTokenClass EVar4;
  char *__s;
  size_t sVar5;
  TSymbol *pTVar6;
  TBasicType TVar7;
  int iVar8;
  EShMessages EVar9;
  TBasicType t;
  TBasicType TVar10;
  HlslGrammar *this_00;
  int iVar11;
  TString name;
  int iVar12;
  TString local_58;
  
  EVar9 = (this->parseContext->super_TParseContextBase).super_TParseVersions.messages &
          EShMsgHlslEnable16BitTypes;
  if (this->typeIdentifiers == true) {
    this_00 = this;
    EVar4 = HlslTokenStream::peek(&this->super_HlslTokenStream);
    __s = getTypeString(this_00,EVar4);
    if (__s != (char *)0x0) {
      local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      sVar5 = strlen(__s);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_58,__s,__s + sVar5);
      pTVar6 = TSymbolTable::find((this->parseContext->super_TParseContextBase).symbolTable,
                                  &local_58,(bool *)0x0,(bool *)0x0,(int *)0x0);
      if (pTVar6 != (TSymbol *)0x0) {
        return false;
      }
    }
  }
  EVar4 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  bVar2 = 0;
  if (EVar4 == EHTokUnorm) {
    bVar1 = bVar2;
    bVar2 = 1;
LAB_00428b28:
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  }
  else {
    bVar1 = 0;
    if (EVar4 == EHTokSNorm) {
      bVar1 = 1;
      bVar2 = 0;
      goto LAB_00428b28;
    }
  }
  EVar4 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  bVar3 = false;
  if (0x11b < EVar4 - EHTokPointStream) {
    return false;
  }
  t = (EVar9 >> 10) + EbtFloat;
  TVar10 = (uint)(EVar9 == EShMsgDefault) * 2 + EbtInt16;
  TVar7 = (uint)(EVar9 == EShMsgDefault) * 2 + EbtUint16;
  switch(EVar4) {
  case EHTokPointStream:
  case EHTokLineStream:
  case EHTokTriangleStream:
    bVar3 = acceptStreamOutTemplateType(this,type,(TLayoutGeometry *)&local_58);
    if (!bVar3) {
      return false;
    }
    bVar3 = HlslParseContext::handleOutputGeometry
                      (this->parseContext,&(this->super_HlslTokenStream).token.loc,
                       (TLayoutGeometry *)&local_58);
    return bVar3;
  case EHTokInputPatch:
  case EHTokOutputPatch:
    bVar3 = acceptTessellationPatchTemplateType(this,type);
    return bVar3;
  default:
    bVar3 = acceptTextureType(this,type);
    return bVar3;
  case EHTokVector:
    bVar3 = acceptVectorTemplateType(this,type);
    return bVar3;
  case EHTokMatrix:
    bVar3 = acceptMatrixTemplateType(this,type);
    return bVar3;
  case EHTokVoid:
    t = EbtVoid;
    goto LAB_00429fe1;
  case EHTokString:
    t = EbtString;
    goto LAB_00429fe1;
  case EHTokBool:
    t = EbtBool;
    goto LAB_00429fe1;
  case EHTokInt:
  case EHTokDword:
    t = EbtInt;
    goto LAB_00429fe1;
  case EHTokUint:
    t = EbtUint;
    goto LAB_00429fe1;
  case EHTokUint64:
    t = EbtUint64;
    goto LAB_00429fe1;
  case EHTokHalf:
    goto LAB_00429fe1;
  case EHTokFloat:
    t = EbtFloat;
    goto LAB_00429fe1;
  case EHTokDouble:
    t = EbtDouble;
LAB_00429fe1:
    iVar8 = 1;
LAB_0042a005:
    iVar12 = 0;
    iVar11 = 0;
LAB_0042a00b:
    TType::TType(type,t,EvqTemporary,iVar8,iVar12,iVar11,false);
    goto LAB_0042a010;
  case EHTokMin16float:
  case EHTokMin10float:
    goto LAB_004290fb;
  case EHTokMin16int:
  case EHTokMin12int:
    t = TVar10;
    goto LAB_004290fb;
  case EHTokMin16uint:
    t = TVar7;
LAB_004290fb:
    iVar8 = 1;
LAB_00429b6d:
    iVar12 = 0;
    iVar11 = 0;
    goto LAB_00429b70;
  case EHTokBool1:
    t = EbtBool;
    goto LAB_00429f3d;
  case EHTokBool2:
    t = EbtBool;
    goto LAB_00429ffe;
  case EHTokBool3:
    t = EbtBool;
    goto LAB_00429c41;
  case EHTokBool4:
    t = EbtBool;
    goto LAB_00429e5d;
  case EHTokFloat1:
    t = EbtFloat;
    goto LAB_00429f3d;
  case EHTokFloat2:
    t = EbtFloat;
    goto LAB_00429ffe;
  case EHTokFloat3:
    t = EbtFloat;
    goto LAB_00429c41;
  case EHTokFloat4:
    t = EbtFloat;
    goto LAB_00429e5d;
  case EHTokInt1:
    t = EbtInt;
    goto LAB_00429f3d;
  case EHTokInt2:
    t = EbtInt;
    goto LAB_00429ffe;
  case EHTokInt3:
    t = EbtInt;
    goto LAB_00429c41;
  case EHTokInt4:
    t = EbtInt;
    goto LAB_00429e5d;
  case EHTokDouble1:
    t = EbtDouble;
    goto LAB_00429f3d;
  case EHTokDouble2:
    t = EbtDouble;
    goto LAB_00429ffe;
  case EHTokDouble3:
    t = EbtDouble;
    goto LAB_00429c41;
  case EHTokDouble4:
    t = EbtDouble;
    goto LAB_00429e5d;
  case EHTokUint1:
    t = EbtUint;
    goto LAB_00429f3d;
  case EHTokUint2:
    t = EbtUint;
    goto LAB_00429ffe;
  case EHTokUint3:
    t = EbtUint;
    goto LAB_00429c41;
  case EHTokUint4:
    t = EbtUint;
    goto LAB_00429e5d;
  case EHTokHalf1:
LAB_00429f3d:
    TType::TType(type,t,EvqTemporary,1,0,0,false);
LAB_00429f4f:
    type->field_0xa = type->field_0xa | 0x10;
    goto LAB_0042a010;
  case EHTokHalf2:
LAB_00429ffe:
    iVar8 = 2;
    goto LAB_0042a005;
  case EHTokHalf3:
LAB_00429c41:
    iVar8 = 3;
    goto LAB_0042a005;
  case EHTokHalf4:
LAB_00429e5d:
    iVar8 = 4;
    goto LAB_0042a005;
  case EHTokMin16float1:
  case EHTokMin10float1:
    goto LAB_00429054;
  case EHTokMin16float2:
  case EHTokMin10float2:
    goto LAB_00429b60;
  case EHTokMin16float3:
  case EHTokMin10float3:
    goto LAB_00429152;
  case EHTokMin16float4:
  case EHTokMin10float4:
    goto LAB_00429a91;
  case EHTokMin16int1:
  case EHTokMin12int1:
    t = TVar10;
    goto LAB_00429054;
  case EHTokMin16int2:
  case EHTokMin12int2:
    t = TVar10;
    goto LAB_00429b60;
  case EHTokMin16int3:
  case EHTokMin12int3:
    t = TVar10;
    goto LAB_00429152;
  case EHTokMin16int4:
  case EHTokMin12int4:
    t = TVar10;
    goto LAB_00429a91;
  case EHTokMin16uint1:
    t = TVar7;
LAB_00429054:
    TType::TType(type,t,EvqTemporary,EpqMedium,1,0,0,false);
    goto LAB_00429f4f;
  case EHTokMin16uint2:
    t = TVar7;
LAB_00429b60:
    iVar8 = 2;
    goto LAB_00429b6d;
  case EHTokMin16uint3:
    t = TVar7;
LAB_00429152:
    iVar8 = 3;
    goto LAB_00429b6d;
  case EHTokMin16uint4:
    t = TVar7;
LAB_00429a91:
    iVar8 = 4;
    goto LAB_00429b6d;
  case EHTokInt1x1:
    t = EbtInt;
    goto LAB_00429fbb;
  case EHTokInt1x2:
    t = EbtInt;
    goto LAB_00429b8e;
  case EHTokInt1x3:
    t = EbtInt;
    goto LAB_00429e7d;
  case EHTokInt1x4:
    t = EbtInt;
    goto LAB_00429d08;
  case EHTokInt2x1:
    t = EbtInt;
    goto LAB_00429ef1;
  case EHTokInt2x2:
    t = EbtInt;
    goto LAB_00429f82;
  case EHTokInt2x3:
    t = EbtInt;
    goto LAB_00429f14;
  case EHTokInt2x4:
    t = EbtInt;
    goto LAB_00429def;
  case EHTokInt3x1:
    t = EbtInt;
    goto LAB_00429d7a;
  case EHTokInt3x2:
    t = EbtInt;
    goto LAB_00429eb9;
  case EHTokInt3x3:
    t = EbtInt;
    goto LAB_00429d41;
  case EHTokInt3x4:
    t = EbtInt;
    goto LAB_00429ce5;
  case EHTokInt4x1:
    t = EbtInt;
    goto LAB_00429b0c;
  case EHTokInt4x2:
    t = EbtInt;
    goto LAB_00429db3;
  case EHTokInt4x3:
    t = EbtInt;
    goto LAB_00429ae9;
  case EHTokInt4x4:
    t = EbtInt;
    goto LAB_00429cc2;
  case EHTokUint1x1:
    t = EbtUint;
    goto LAB_00429fbb;
  case EHTokUint1x2:
    t = EbtUint;
    goto LAB_00429b8e;
  case EHTokUint1x3:
    t = EbtUint;
    goto LAB_00429e7d;
  case EHTokUint1x4:
    t = EbtUint;
    goto LAB_00429d08;
  case EHTokUint2x1:
    t = EbtUint;
    goto LAB_00429ef1;
  case EHTokUint2x2:
    t = EbtUint;
    goto LAB_00429f82;
  case EHTokUint2x3:
    t = EbtUint;
    goto LAB_00429f14;
  case EHTokUint2x4:
    t = EbtUint;
    goto LAB_00429def;
  case EHTokUint3x1:
    t = EbtUint;
    goto LAB_00429d7a;
  case EHTokUint3x2:
    t = EbtUint;
    goto LAB_00429eb9;
  case EHTokUint3x3:
    t = EbtUint;
    goto LAB_00429d41;
  case EHTokUint3x4:
    t = EbtUint;
    goto LAB_00429ce5;
  case EHTokUint4x1:
    t = EbtUint;
    goto LAB_00429b0c;
  case EHTokUint4x2:
    t = EbtUint;
    goto LAB_00429db3;
  case EHTokUint4x3:
    t = EbtUint;
    goto LAB_00429ae9;
  case EHTokUint4x4:
    t = EbtUint;
    goto LAB_00429cc2;
  case EHTokBool1x1:
    t = EbtBool;
    goto LAB_00429fbb;
  case EHTokBool1x2:
    t = EbtBool;
    goto LAB_00429b8e;
  case EHTokBool1x3:
    t = EbtBool;
    goto LAB_00429e7d;
  case EHTokBool1x4:
    t = EbtBool;
    goto LAB_00429d08;
  case EHTokBool2x1:
    t = EbtBool;
    goto LAB_00429ef1;
  case EHTokBool2x2:
    t = EbtBool;
    goto LAB_00429f82;
  case EHTokBool2x3:
    t = EbtBool;
    goto LAB_00429f14;
  case EHTokBool2x4:
    t = EbtBool;
    goto LAB_00429def;
  case EHTokBool3x1:
    t = EbtBool;
    goto LAB_00429d7a;
  case EHTokBool3x2:
    t = EbtBool;
    goto LAB_00429eb9;
  case EHTokBool3x3:
    t = EbtBool;
    goto LAB_00429d41;
  case EHTokBool3x4:
    t = EbtBool;
    goto LAB_00429ce5;
  case EHTokBool4x1:
    t = EbtBool;
    goto LAB_00429b0c;
  case EHTokBool4x2:
    t = EbtBool;
    goto LAB_00429db3;
  case EHTokBool4x3:
    t = EbtBool;
    goto LAB_00429ae9;
  case EHTokBool4x4:
    t = EbtBool;
    goto LAB_00429cc2;
  case EHTokFloat1x1:
    t = EbtFloat;
    goto LAB_00429fbb;
  case EHTokFloat1x2:
    t = EbtFloat;
    goto LAB_00429b8e;
  case EHTokFloat1x3:
    t = EbtFloat;
    goto LAB_00429e7d;
  case EHTokFloat1x4:
    t = EbtFloat;
    goto LAB_00429d08;
  case EHTokFloat2x1:
    t = EbtFloat;
    goto LAB_00429ef1;
  case EHTokFloat2x2:
    t = EbtFloat;
    goto LAB_00429f82;
  case EHTokFloat2x3:
    t = EbtFloat;
    goto LAB_00429f14;
  case EHTokFloat2x4:
    t = EbtFloat;
    goto LAB_00429def;
  case EHTokFloat3x1:
    t = EbtFloat;
    goto LAB_00429d7a;
  case EHTokFloat3x2:
    t = EbtFloat;
    goto LAB_00429eb9;
  case EHTokFloat3x3:
    t = EbtFloat;
    goto LAB_00429d41;
  case EHTokFloat3x4:
    t = EbtFloat;
    goto LAB_00429ce5;
  case EHTokFloat4x1:
    t = EbtFloat;
    goto LAB_00429b0c;
  case EHTokFloat4x2:
    t = EbtFloat;
    goto LAB_00429db3;
  case EHTokFloat4x3:
    t = EbtFloat;
    goto LAB_00429ae9;
  case EHTokFloat4x4:
    t = EbtFloat;
    goto LAB_00429cc2;
  case EHTokHalf1x1:
    goto LAB_00429fbb;
  case EHTokHalf1x2:
    goto LAB_00429b8e;
  case EHTokHalf1x3:
    goto LAB_00429e7d;
  case EHTokHalf1x4:
    goto LAB_00429d08;
  case EHTokHalf2x1:
    goto LAB_00429ef1;
  case EHTokHalf2x2:
    goto LAB_00429f82;
  case EHTokHalf2x3:
    goto LAB_00429f14;
  case EHTokHalf2x4:
    goto LAB_00429def;
  case EHTokHalf3x1:
    goto LAB_00429d7a;
  case EHTokHalf3x2:
    goto LAB_00429eb9;
  case EHTokHalf3x3:
    goto LAB_00429d41;
  case EHTokHalf3x4:
    goto LAB_00429ce5;
  case EHTokHalf4x1:
    goto LAB_00429b0c;
  case EHTokHalf4x2:
    goto LAB_00429db3;
  case EHTokHalf4x3:
    goto LAB_00429ae9;
  case EHTokHalf4x4:
    goto LAB_00429cc2;
  case EHTokDouble1x1:
    t = EbtDouble;
LAB_00429fbb:
    iVar12 = 1;
LAB_00429fc5:
    iVar8 = 0;
    iVar11 = 1;
    goto LAB_0042a00b;
  case EHTokDouble1x2:
    t = EbtDouble;
LAB_00429b8e:
    iVar12 = 1;
LAB_00429f8c:
    iVar8 = 0;
    iVar11 = 2;
    goto LAB_0042a00b;
  case EHTokDouble1x3:
    t = EbtDouble;
LAB_00429e7d:
    iVar12 = 1;
LAB_00429f1e:
    iVar8 = 0;
    iVar11 = 3;
    goto LAB_0042a00b;
  case EHTokDouble1x4:
    t = EbtDouble;
LAB_00429d08:
    iVar12 = 1;
LAB_00429df9:
    iVar8 = 0;
    iVar11 = 4;
    goto LAB_0042a00b;
  case EHTokDouble2x1:
    t = EbtDouble;
LAB_00429ef1:
    iVar12 = 2;
    goto LAB_00429fc5;
  case EHTokDouble2x2:
    t = EbtDouble;
LAB_00429f82:
    iVar12 = 2;
    goto LAB_00429f8c;
  case EHTokDouble2x3:
    t = EbtDouble;
LAB_00429f14:
    iVar12 = 2;
    goto LAB_00429f1e;
  case EHTokDouble2x4:
    t = EbtDouble;
LAB_00429def:
    iVar12 = 2;
    goto LAB_00429df9;
  case EHTokDouble3x1:
    t = EbtDouble;
LAB_00429d7a:
    iVar12 = 3;
    goto LAB_00429fc5;
  case EHTokDouble3x2:
    t = EbtDouble;
LAB_00429eb9:
    iVar12 = 3;
    goto LAB_00429f8c;
  case EHTokDouble3x3:
    t = EbtDouble;
LAB_00429d41:
    iVar12 = 3;
    goto LAB_00429f1e;
  case EHTokDouble3x4:
    t = EbtDouble;
LAB_00429ce5:
    iVar12 = 3;
    goto LAB_00429df9;
  case EHTokDouble4x1:
    t = EbtDouble;
LAB_00429b0c:
    iVar12 = 4;
    goto LAB_00429fc5;
  case EHTokDouble4x2:
    t = EbtDouble;
LAB_00429db3:
    iVar12 = 4;
    goto LAB_00429f8c;
  case EHTokDouble4x3:
    t = EbtDouble;
LAB_00429ae9:
    iVar12 = 4;
    goto LAB_00429f1e;
  case EHTokDouble4x4:
    t = EbtDouble;
LAB_00429cc2:
    iVar12 = 4;
    goto LAB_00429df9;
  case EHTokMin16float1x1:
  case EHTokMin10float1x1:
    iVar12 = 1;
    break;
  case EHTokMin16float1x2:
  case EHTokMin10float1x2:
    iVar12 = 2;
    break;
  case EHTokMin16float1x3:
  case EHTokMin10float1x3:
    iVar12 = 3;
    break;
  case EHTokMin16float1x4:
  case EHTokMin10float1x4:
    iVar12 = 4;
    break;
  case EHTokMin16float2x1:
  case EHTokMin10float2x1:
    iVar12 = 1;
    goto LAB_00429a21;
  case EHTokMin16float2x2:
  case EHTokMin10float2x2:
    iVar12 = 2;
    goto LAB_00429a21;
  case EHTokMin16float2x3:
  case EHTokMin10float2x3:
    iVar12 = 3;
    goto LAB_00429a21;
  case EHTokMin16float2x4:
  case EHTokMin10float2x4:
    iVar12 = 4;
    goto LAB_00429a21;
  case EHTokMin16float3x1:
  case EHTokMin10float3x1:
    iVar12 = 1;
    goto LAB_004297bb;
  case EHTokMin16float3x2:
  case EHTokMin10float3x2:
    iVar12 = 2;
    goto LAB_004297bb;
  case EHTokMin16float3x3:
  case EHTokMin10float3x3:
    iVar12 = 3;
    goto LAB_004297bb;
  case EHTokMin16float3x4:
  case EHTokMin10float3x4:
    iVar12 = 4;
    goto LAB_004297bb;
  case EHTokMin16float4x1:
  case EHTokMin10float4x1:
    iVar12 = 1;
    goto LAB_0042997a;
  case EHTokMin16float4x2:
  case EHTokMin10float4x2:
    iVar12 = 2;
    goto LAB_0042997a;
  case EHTokMin16float4x3:
  case EHTokMin10float4x3:
    iVar12 = 3;
    goto LAB_0042997a;
  case EHTokMin16float4x4:
  case EHTokMin10float4x4:
    iVar12 = 4;
    goto LAB_0042997a;
  case EHTokMin16int1x1:
  case EHTokMin12int1x1:
    iVar12 = 1;
    t = TVar10;
    break;
  case EHTokMin16int1x2:
  case EHTokMin12int1x2:
    iVar12 = 2;
    t = TVar10;
    break;
  case EHTokMin16int1x3:
  case EHTokMin12int1x3:
    iVar12 = 3;
    t = TVar10;
    break;
  case EHTokMin16int1x4:
  case EHTokMin12int1x4:
    iVar12 = 4;
    t = TVar10;
    break;
  case EHTokMin16int2x1:
  case EHTokMin12int2x1:
    iVar12 = 1;
    t = TVar10;
    goto LAB_00429a21;
  case EHTokMin16int2x2:
  case EHTokMin12int2x2:
    iVar12 = 2;
    t = TVar10;
    goto LAB_00429a21;
  case EHTokMin16int2x3:
  case EHTokMin12int2x3:
    iVar12 = 3;
    t = TVar10;
    goto LAB_00429a21;
  case EHTokMin16int2x4:
  case EHTokMin12int2x4:
    iVar12 = 4;
    t = TVar10;
    goto LAB_00429a21;
  case EHTokMin16int3x1:
  case EHTokMin12int3x1:
    iVar12 = 1;
    t = TVar10;
    goto LAB_004297bb;
  case EHTokMin16int3x2:
  case EHTokMin12int3x2:
    iVar12 = 2;
    t = TVar10;
    goto LAB_004297bb;
  case EHTokMin16int3x3:
  case EHTokMin12int3x3:
    iVar12 = 3;
    t = TVar10;
    goto LAB_004297bb;
  case EHTokMin16int3x4:
  case EHTokMin12int3x4:
    iVar12 = 4;
    t = TVar10;
    goto LAB_004297bb;
  case EHTokMin16int4x1:
  case EHTokMin12int4x1:
    iVar12 = 1;
    t = TVar10;
    goto LAB_0042997a;
  case EHTokMin16int4x2:
  case EHTokMin12int4x2:
    iVar12 = 2;
    t = TVar10;
    goto LAB_0042997a;
  case EHTokMin16int4x3:
  case EHTokMin12int4x3:
    iVar12 = 3;
    t = TVar10;
    goto LAB_0042997a;
  case EHTokMin16int4x4:
  case EHTokMin12int4x4:
    iVar12 = 4;
    t = TVar10;
    goto LAB_0042997a;
  case EHTokMin16uint1x1:
    iVar12 = 1;
    t = TVar7;
    break;
  case EHTokMin16uint1x2:
    iVar12 = 2;
    t = TVar7;
    break;
  case EHTokMin16uint1x3:
    iVar12 = 3;
    t = TVar7;
    break;
  case EHTokMin16uint1x4:
    iVar12 = 4;
    t = TVar7;
    break;
  case EHTokMin16uint2x1:
    iVar12 = 1;
    t = TVar7;
    goto LAB_00429a21;
  case EHTokMin16uint2x2:
    iVar12 = 2;
    t = TVar7;
    goto LAB_00429a21;
  case EHTokMin16uint2x3:
    iVar12 = 3;
    t = TVar7;
    goto LAB_00429a21;
  case EHTokMin16uint2x4:
    iVar12 = 4;
    t = TVar7;
LAB_00429a21:
    iVar8 = 0;
    iVar11 = 2;
    goto LAB_00429b70;
  case EHTokMin16uint3x1:
    iVar12 = 1;
    t = TVar7;
    goto LAB_004297bb;
  case EHTokMin16uint3x2:
    iVar12 = 2;
    t = TVar7;
    goto LAB_004297bb;
  case EHTokMin16uint3x3:
    iVar12 = 3;
    t = TVar7;
    goto LAB_004297bb;
  case EHTokMin16uint3x4:
    iVar12 = 4;
    t = TVar7;
LAB_004297bb:
    iVar8 = 0;
    iVar11 = 3;
    goto LAB_00429b70;
  case EHTokMin16uint4x1:
    iVar12 = 1;
    t = TVar7;
    goto LAB_0042997a;
  case EHTokMin16uint4x2:
    iVar12 = 2;
    t = TVar7;
    goto LAB_0042997a;
  case EHTokMin16uint4x3:
    iVar12 = 3;
    t = TVar7;
    goto LAB_0042997a;
  case EHTokMin16uint4x4:
    iVar12 = 4;
    t = TVar7;
LAB_0042997a:
    iVar8 = 0;
    iVar11 = 4;
    goto LAB_00429b70;
  case EHTokSampler:
  case EHTokSampler1d:
  case EHTokSampler2d:
  case EHTokSampler3d:
  case EHTokSamplerCube:
    if (((this->parseContext->super_TParseContextBase).super_TParseVersions.messages &
        EShMsgHlslDX9Compatible) != EShMsgDefault) {
      bVar3 = acceptSamplerTypeDX9(this,type);
      return bVar3;
    }
  case EHTokSamplerState:
  case EHTokSamplerComparisonState:
    bVar3 = acceptSamplerType(this,type);
    return bVar3;
  case EHTokTexture:
  case EHTokTypedef:
  case EHTokThis:
  case EHTokNamespace:
    goto switchD_00428b82_caseD_118;
  case EHTokSubpassInput:
  case EHTokSubpassInputMS:
    bVar3 = acceptSubpassInputType(this,type);
    return bVar3;
  case EHTokAppendStructuredBuffer:
  case EHTokByteAddressBuffer:
  case EHTokConsumeStructuredBuffer:
  case EHTokRWByteAddressBuffer:
  case EHTokRWStructuredBuffer:
  case EHTokStructuredBuffer:
    bVar3 = acceptStructBufferType(this,type);
    return bVar3;
  case EHTokTextureBuffer:
    bVar3 = acceptTextureBufferType(this,type);
    return bVar3;
  case EHTokIdentifier:
    pTVar6 = HlslParseContext::lookupUserType
                       (this->parseContext,(this->super_HlslTokenStream).token.field_2.string,type);
    if (pTVar6 == (TSymbol *)0x0) {
      return false;
    }
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    return true;
  case EHTokClass:
  case EHTokStruct:
  case EHTokCBuffer:
  case EHTokTBuffer:
    bVar3 = acceptStruct(this,type,nodeList);
    return bVar3;
  case EHTokConstantBuffer:
    bVar3 = acceptConstantBufferType(this,type);
    goto switchD_00428b82_caseD_118;
  }
  iVar8 = 0;
  iVar11 = 1;
LAB_00429b70:
  TType::TType(type,t,EvqTemporary,EpqMedium,iVar8,iVar11,iVar12,false);
LAB_0042a010:
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  bVar3 = true;
  if (((bool)(bVar2 | bVar1)) && (iVar12 = (*type->_vptr_TType[0x26])(type), (char)iVar12 == '\0'))
  {
    bVar3 = false;
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this->parseContext,&(this->super_HlslTokenStream).token,
               "unorm and snorm only valid in floating point domain","","");
  }
switchD_00428b82_caseD_118:
  return bVar3;
}

Assistant:

bool HlslGrammar::acceptType(TType& type, TIntermNode*& nodeList)
{
    // Basic types for min* types, use native halfs if the option allows them.
    bool enable16BitTypes = parseContext.hlslEnable16BitTypes();

    const TBasicType min16float_bt = enable16BitTypes ? EbtFloat16 : EbtFloat;
    const TBasicType min10float_bt = enable16BitTypes ? EbtFloat16 : EbtFloat;
    const TBasicType half_bt       = enable16BitTypes ? EbtFloat16 : EbtFloat;
    const TBasicType min16int_bt   = enable16BitTypes ? EbtInt16   : EbtInt;
    const TBasicType min12int_bt   = enable16BitTypes ? EbtInt16   : EbtInt;
    const TBasicType min16uint_bt  = enable16BitTypes ? EbtUint16  : EbtUint;

    // Some types might have turned into identifiers. Take the hit for checking
    // when this has happened.
    if (typeIdentifiers) {
        const char* identifierString = getTypeString(peek());
        if (identifierString != nullptr) {
            TString name = identifierString;
            // if it's an identifier, it's not a type
            if (parseContext.symbolTable.find(name) != nullptr)
                return false;
        }
    }

    bool isUnorm = false;
    bool isSnorm = false;

    // Accept snorm and unorm.  Presently, this is ignored, save for an error check below.
    switch (peek()) {
    case EHTokUnorm:
        isUnorm = true;
        advanceToken();  // eat the token
        break;
    case EHTokSNorm:
        isSnorm = true;
        advanceToken();  // eat the token
        break;
    default:
        break;
    }

    switch (peek()) {
    case EHTokVector:
        return acceptVectorTemplateType(type);
        break;

    case EHTokMatrix:
        return acceptMatrixTemplateType(type);
        break;

    case EHTokPointStream:            // fall through
    case EHTokLineStream:             // ...
    case EHTokTriangleStream:         // ...
        {
            TLayoutGeometry geometry;
            if (! acceptStreamOutTemplateType(type, geometry))
                return false;

            if (! parseContext.handleOutputGeometry(token.loc, geometry))
                return false;

            return true;
        }

    case EHTokInputPatch:             // fall through
    case EHTokOutputPatch:            // ...
        {
            if (! acceptTessellationPatchTemplateType(type))
                return false;

            return true;
        }

    case EHTokSampler:                // fall through
    case EHTokSampler1d:              // ...
    case EHTokSampler2d:              // ...
    case EHTokSampler3d:              // ...
    case EHTokSamplerCube:            // ...
        if (parseContext.hlslDX9Compatible())
            return acceptSamplerTypeDX9(type);
        else
            return acceptSamplerType(type);
        break;

    case EHTokSamplerState:           // fall through
    case EHTokSamplerComparisonState: // ...
        return acceptSamplerType(type);
        break;

    case EHTokSubpassInput:           // fall through
    case EHTokSubpassInputMS:         // ...
        return acceptSubpassInputType(type);
        break;

    case EHTokBuffer:                 // fall through
    case EHTokTexture1d:              // ...
    case EHTokTexture1darray:         // ...
    case EHTokTexture2d:              // ...
    case EHTokTexture2darray:         // ...
    case EHTokTexture3d:              // ...
    case EHTokTextureCube:            // ...
    case EHTokTextureCubearray:       // ...
    case EHTokTexture2DMS:            // ...
    case EHTokTexture2DMSarray:       // ...
    case EHTokRWTexture1d:            // ...
    case EHTokRWTexture1darray:       // ...
    case EHTokRWTexture2d:            // ...
    case EHTokRWTexture2darray:       // ...
    case EHTokRWTexture3d:            // ...
    case EHTokRWBuffer:               // ...
        return acceptTextureType(type);
        break;

    case EHTokAppendStructuredBuffer:
    case EHTokByteAddressBuffer:
    case EHTokConsumeStructuredBuffer:
    case EHTokRWByteAddressBuffer:
    case EHTokRWStructuredBuffer:
    case EHTokStructuredBuffer:
        return acceptStructBufferType(type);
        break;

    case EHTokTextureBuffer:
        return acceptTextureBufferType(type);
        break;

    case EHTokConstantBuffer:
        return acceptConstantBufferType(type);

    case EHTokClass:
    case EHTokStruct:
    case EHTokCBuffer:
    case EHTokTBuffer:
        return acceptStruct(type, nodeList);

    case EHTokIdentifier:
        // An identifier could be for a user-defined type.
        // Note we cache the symbol table lookup, to save for a later rule
        // when this is not a type.
        if (parseContext.lookupUserType(*token.string, type) != nullptr) {
            advanceToken();
            return true;
        } else
            return false;

    case EHTokVoid:
        new(&type) TType(EbtVoid);
        break;

    case EHTokString:
        new(&type) TType(EbtString);
        break;

    case EHTokFloat:
        new(&type) TType(EbtFloat);
        break;
    case EHTokFloat1:
        new(&type) TType(EbtFloat);
        type.makeVector();
        break;
    case EHTokFloat2:
        new(&type) TType(EbtFloat, EvqTemporary, 2);
        break;
    case EHTokFloat3:
        new(&type) TType(EbtFloat, EvqTemporary, 3);
        break;
    case EHTokFloat4:
        new(&type) TType(EbtFloat, EvqTemporary, 4);
        break;

    case EHTokDouble:
        new(&type) TType(EbtDouble);
        break;
    case EHTokDouble1:
        new(&type) TType(EbtDouble);
        type.makeVector();
        break;
    case EHTokDouble2:
        new(&type) TType(EbtDouble, EvqTemporary, 2);
        break;
    case EHTokDouble3:
        new(&type) TType(EbtDouble, EvqTemporary, 3);
        break;
    case EHTokDouble4:
        new(&type) TType(EbtDouble, EvqTemporary, 4);
        break;

    case EHTokInt:
    case EHTokDword:
        new(&type) TType(EbtInt);
        break;
    case EHTokInt1:
        new(&type) TType(EbtInt);
        type.makeVector();
        break;
    case EHTokInt2:
        new(&type) TType(EbtInt, EvqTemporary, 2);
        break;
    case EHTokInt3:
        new(&type) TType(EbtInt, EvqTemporary, 3);
        break;
    case EHTokInt4:
        new(&type) TType(EbtInt, EvqTemporary, 4);
        break;

    case EHTokUint:
        new(&type) TType(EbtUint);
        break;
    case EHTokUint1:
        new(&type) TType(EbtUint);
        type.makeVector();
        break;
    case EHTokUint2:
        new(&type) TType(EbtUint, EvqTemporary, 2);
        break;
    case EHTokUint3:
        new(&type) TType(EbtUint, EvqTemporary, 3);
        break;
    case EHTokUint4:
        new(&type) TType(EbtUint, EvqTemporary, 4);
        break;

    case EHTokUint64:
        new(&type) TType(EbtUint64);
        break;

    case EHTokBool:
        new(&type) TType(EbtBool);
        break;
    case EHTokBool1:
        new(&type) TType(EbtBool);
        type.makeVector();
        break;
    case EHTokBool2:
        new(&type) TType(EbtBool, EvqTemporary, 2);
        break;
    case EHTokBool3:
        new(&type) TType(EbtBool, EvqTemporary, 3);
        break;
    case EHTokBool4:
        new(&type) TType(EbtBool, EvqTemporary, 4);
        break;

    case EHTokHalf:
        new(&type) TType(half_bt, EvqTemporary);
        break;
    case EHTokHalf1:
        new(&type) TType(half_bt, EvqTemporary);
        type.makeVector();
        break;
    case EHTokHalf2:
        new(&type) TType(half_bt, EvqTemporary, 2);
        break;
    case EHTokHalf3:
        new(&type) TType(half_bt, EvqTemporary, 3);
        break;
    case EHTokHalf4:
        new(&type) TType(half_bt, EvqTemporary, 4);
        break;

    case EHTokMin16float:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin16float1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin16float2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin16float3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin16float4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokMin10float:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin10float1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin10float2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin10float3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin10float4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokMin16int:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin16int1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin16int2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin16int3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin16int4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokMin12int:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin12int1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin12int2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin12int3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin12int4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokMin16uint:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin16uint1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin16uint2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin16uint3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin16uint4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokInt1x1:
        new(&type) TType(EbtInt, EvqTemporary, 0, 1, 1);
        break;
    case EHTokInt1x2:
        new(&type) TType(EbtInt, EvqTemporary, 0, 1, 2);
        break;
    case EHTokInt1x3:
        new(&type) TType(EbtInt, EvqTemporary, 0, 1, 3);
        break;
    case EHTokInt1x4:
        new(&type) TType(EbtInt, EvqTemporary, 0, 1, 4);
        break;
    case EHTokInt2x1:
        new(&type) TType(EbtInt, EvqTemporary, 0, 2, 1);
        break;
    case EHTokInt2x2:
        new(&type) TType(EbtInt, EvqTemporary, 0, 2, 2);
        break;
    case EHTokInt2x3:
        new(&type) TType(EbtInt, EvqTemporary, 0, 2, 3);
        break;
    case EHTokInt2x4:
        new(&type) TType(EbtInt, EvqTemporary, 0, 2, 4);
        break;
    case EHTokInt3x1:
        new(&type) TType(EbtInt, EvqTemporary, 0, 3, 1);
        break;
    case EHTokInt3x2:
        new(&type) TType(EbtInt, EvqTemporary, 0, 3, 2);
        break;
    case EHTokInt3x3:
        new(&type) TType(EbtInt, EvqTemporary, 0, 3, 3);
        break;
    case EHTokInt3x4:
        new(&type) TType(EbtInt, EvqTemporary, 0, 3, 4);
        break;
    case EHTokInt4x1:
        new(&type) TType(EbtInt, EvqTemporary, 0, 4, 1);
        break;
    case EHTokInt4x2:
        new(&type) TType(EbtInt, EvqTemporary, 0, 4, 2);
        break;
    case EHTokInt4x3:
        new(&type) TType(EbtInt, EvqTemporary, 0, 4, 3);
        break;
    case EHTokInt4x4:
        new(&type) TType(EbtInt, EvqTemporary, 0, 4, 4);
        break;

    case EHTokUint1x1:
        new(&type) TType(EbtUint, EvqTemporary, 0, 1, 1);
        break;
    case EHTokUint1x2:
        new(&type) TType(EbtUint, EvqTemporary, 0, 1, 2);
        break;
    case EHTokUint1x3:
        new(&type) TType(EbtUint, EvqTemporary, 0, 1, 3);
        break;
    case EHTokUint1x4:
        new(&type) TType(EbtUint, EvqTemporary, 0, 1, 4);
        break;
    case EHTokUint2x1:
        new(&type) TType(EbtUint, EvqTemporary, 0, 2, 1);
        break;
    case EHTokUint2x2:
        new(&type) TType(EbtUint, EvqTemporary, 0, 2, 2);
        break;
    case EHTokUint2x3:
        new(&type) TType(EbtUint, EvqTemporary, 0, 2, 3);
        break;
    case EHTokUint2x4:
        new(&type) TType(EbtUint, EvqTemporary, 0, 2, 4);
        break;
    case EHTokUint3x1:
        new(&type) TType(EbtUint, EvqTemporary, 0, 3, 1);
        break;
    case EHTokUint3x2:
        new(&type) TType(EbtUint, EvqTemporary, 0, 3, 2);
        break;
    case EHTokUint3x3:
        new(&type) TType(EbtUint, EvqTemporary, 0, 3, 3);
        break;
    case EHTokUint3x4:
        new(&type) TType(EbtUint, EvqTemporary, 0, 3, 4);
        break;
    case EHTokUint4x1:
        new(&type) TType(EbtUint, EvqTemporary, 0, 4, 1);
        break;
    case EHTokUint4x2:
        new(&type) TType(EbtUint, EvqTemporary, 0, 4, 2);
        break;
    case EHTokUint4x3:
        new(&type) TType(EbtUint, EvqTemporary, 0, 4, 3);
        break;
    case EHTokUint4x4:
        new(&type) TType(EbtUint, EvqTemporary, 0, 4, 4);
        break;

    case EHTokBool1x1:
        new(&type) TType(EbtBool, EvqTemporary, 0, 1, 1);
        break;
    case EHTokBool1x2:
        new(&type) TType(EbtBool, EvqTemporary, 0, 1, 2);
        break;
    case EHTokBool1x3:
        new(&type) TType(EbtBool, EvqTemporary, 0, 1, 3);
        break;
    case EHTokBool1x4:
        new(&type) TType(EbtBool, EvqTemporary, 0, 1, 4);
        break;
    case EHTokBool2x1:
        new(&type) TType(EbtBool, EvqTemporary, 0, 2, 1);
        break;
    case EHTokBool2x2:
        new(&type) TType(EbtBool, EvqTemporary, 0, 2, 2);
        break;
    case EHTokBool2x3:
        new(&type) TType(EbtBool, EvqTemporary, 0, 2, 3);
        break;
    case EHTokBool2x4:
        new(&type) TType(EbtBool, EvqTemporary, 0, 2, 4);
        break;
    case EHTokBool3x1:
        new(&type) TType(EbtBool, EvqTemporary, 0, 3, 1);
        break;
    case EHTokBool3x2:
        new(&type) TType(EbtBool, EvqTemporary, 0, 3, 2);
        break;
    case EHTokBool3x3:
        new(&type) TType(EbtBool, EvqTemporary, 0, 3, 3);
        break;
    case EHTokBool3x4:
        new(&type) TType(EbtBool, EvqTemporary, 0, 3, 4);
        break;
    case EHTokBool4x1:
        new(&type) TType(EbtBool, EvqTemporary, 0, 4, 1);
        break;
    case EHTokBool4x2:
        new(&type) TType(EbtBool, EvqTemporary, 0, 4, 2);
        break;
    case EHTokBool4x3:
        new(&type) TType(EbtBool, EvqTemporary, 0, 4, 3);
        break;
    case EHTokBool4x4:
        new(&type) TType(EbtBool, EvqTemporary, 0, 4, 4);
        break;

    case EHTokFloat1x1:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 1, 1);
        break;
    case EHTokFloat1x2:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 1, 2);
        break;
    case EHTokFloat1x3:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 1, 3);
        break;
    case EHTokFloat1x4:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 1, 4);
        break;
    case EHTokFloat2x1:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 2, 1);
        break;
    case EHTokFloat2x2:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 2, 2);
        break;
    case EHTokFloat2x3:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 2, 3);
        break;
    case EHTokFloat2x4:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 2, 4);
        break;
    case EHTokFloat3x1:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 3, 1);
        break;
    case EHTokFloat3x2:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 3, 2);
        break;
    case EHTokFloat3x3:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 3, 3);
        break;
    case EHTokFloat3x4:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 3, 4);
        break;
    case EHTokFloat4x1:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 1);
        break;
    case EHTokFloat4x2:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 2);
        break;
    case EHTokFloat4x3:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 3);
        break;
    case EHTokFloat4x4:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 4);
        break;

    case EHTokHalf1x1:
        new(&type) TType(half_bt, EvqTemporary, 0, 1, 1);
        break;
    case EHTokHalf1x2:
        new(&type) TType(half_bt, EvqTemporary, 0, 1, 2);
        break;
    case EHTokHalf1x3:
        new(&type) TType(half_bt, EvqTemporary, 0, 1, 3);
        break;
    case EHTokHalf1x4:
        new(&type) TType(half_bt, EvqTemporary, 0, 1, 4);
        break;
    case EHTokHalf2x1:
        new(&type) TType(half_bt, EvqTemporary, 0, 2, 1);
        break;
    case EHTokHalf2x2:
        new(&type) TType(half_bt, EvqTemporary, 0, 2, 2);
        break;
    case EHTokHalf2x3:
        new(&type) TType(half_bt, EvqTemporary, 0, 2, 3);
        break;
    case EHTokHalf2x4:
        new(&type) TType(half_bt, EvqTemporary, 0, 2, 4);
        break;
    case EHTokHalf3x1:
        new(&type) TType(half_bt, EvqTemporary, 0, 3, 1);
        break;
    case EHTokHalf3x2:
        new(&type) TType(half_bt, EvqTemporary, 0, 3, 2);
        break;
    case EHTokHalf3x3:
        new(&type) TType(half_bt, EvqTemporary, 0, 3, 3);
        break;
    case EHTokHalf3x4:
        new(&type) TType(half_bt, EvqTemporary, 0, 3, 4);
        break;
    case EHTokHalf4x1:
        new(&type) TType(half_bt, EvqTemporary, 0, 4, 1);
        break;
    case EHTokHalf4x2:
        new(&type) TType(half_bt, EvqTemporary, 0, 4, 2);
        break;
    case EHTokHalf4x3:
        new(&type) TType(half_bt, EvqTemporary, 0, 4, 3);
        break;
    case EHTokHalf4x4:
        new(&type) TType(half_bt, EvqTemporary, 0, 4, 4);
        break;

    case EHTokDouble1x1:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 1, 1);
        break;
    case EHTokDouble1x2:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 1, 2);
        break;
    case EHTokDouble1x3:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 1, 3);
        break;
    case EHTokDouble1x4:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 1, 4);
        break;
    case EHTokDouble2x1:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 2, 1);
        break;
    case EHTokDouble2x2:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 2, 2);
        break;
    case EHTokDouble2x3:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 2, 3);
        break;
    case EHTokDouble2x4:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 2, 4);
        break;
    case EHTokDouble3x1:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 3, 1);
        break;
    case EHTokDouble3x2:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 3, 2);
        break;
    case EHTokDouble3x3:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 3, 3);
        break;
    case EHTokDouble3x4:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 3, 4);
        break;
    case EHTokDouble4x1:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 4, 1);
        break;
    case EHTokDouble4x2:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 4, 2);
        break;
    case EHTokDouble4x3:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 4, 3);
        break;
    case EHTokDouble4x4:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 4, 4);
        break;

    case EHTokMin16float1x1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin16float1x2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin16float1x3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin16float1x4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin16float2x1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin16float2x2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin16float2x3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin16float2x4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin16float3x1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin16float3x2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin16float3x3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin16float3x4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin16float4x1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin16float4x2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin16float4x3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin16float4x4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    case EHTokMin10float1x1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin10float1x2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin10float1x3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin10float1x4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin10float2x1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin10float2x2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin10float2x3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin10float2x4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin10float3x1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin10float3x2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin10float3x3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin10float3x4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin10float4x1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin10float4x2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin10float4x3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin10float4x4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    case EHTokMin16int1x1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin16int1x2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin16int1x3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin16int1x4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin16int2x1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin16int2x2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin16int2x3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin16int2x4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin16int3x1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin16int3x2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin16int3x3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin16int3x4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin16int4x1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin16int4x2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin16int4x3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin16int4x4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    case EHTokMin12int1x1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin12int1x2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin12int1x3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin12int1x4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin12int2x1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin12int2x2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin12int2x3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin12int2x4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin12int3x1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin12int3x2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin12int3x3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin12int3x4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin12int4x1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin12int4x2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin12int4x3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin12int4x4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    case EHTokMin16uint1x1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin16uint1x2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin16uint1x3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin16uint1x4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin16uint2x1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin16uint2x2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin16uint2x3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin16uint2x4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin16uint3x1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin16uint3x2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin16uint3x3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin16uint3x4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin16uint4x1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin16uint4x2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin16uint4x3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin16uint4x4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    default:
        return false;
    }

    advanceToken();

    if ((isUnorm || isSnorm) && !type.isFloatingDomain()) {
        parseContext.error(token.loc, "unorm and snorm only valid in floating point domain", "", "");
        return false;
    }

    return true;
}